

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_expression.cpp
# Opt level: O3

void duckdb::BoundParameterExpression::Invalidate(Expression *expr)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  BoundParameterExpression *pBVar3;
  BoundParameterData *pBVar4;
  InternalException *this;
  string local_40;
  
  if ((expr->super_BaseExpression).type == VALUE_PARAMETER) {
    pBVar3 = BaseExpression::Cast<duckdb::BoundParameterExpression>(&expr->super_BaseExpression);
    LogicalType::LogicalType((LogicalType *)&local_40,SQLNULL);
    (pBVar3->super_Expression).return_type.id_ = (LogicalTypeId)local_40._M_dataplus._M_p;
    (pBVar3->super_Expression).return_type.physical_type_ = local_40._M_dataplus._M_p._1_1_;
    peVar1 = (pBVar3->super_Expression).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (pBVar3->super_Expression).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pBVar3->super_Expression).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40._M_string_length;
    (pBVar3->super_Expression).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.field_2._M_allocated_capacity;
    local_40._M_string_length = (size_type)peVar1;
    local_40.field_2._M_allocated_capacity = (size_type)p_Var2;
    LogicalType::~LogicalType((LogicalType *)&local_40);
    LogicalType::LogicalType((LogicalType *)&local_40,INVALID);
    pBVar4 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(&pBVar3->parameter_data);
    (pBVar4->return_type).id_ = (LogicalTypeId)local_40._M_dataplus._M_p;
    (pBVar4->return_type).physical_type_ = local_40._M_dataplus._M_p._1_1_;
    peVar1 = (pBVar4->return_type).type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (pBVar4->return_type).type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pBVar4->return_type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40._M_string_length;
    (pBVar4->return_type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.field_2._M_allocated_capacity;
    local_40._M_string_length = (size_type)peVar1;
    local_40.field_2._M_allocated_capacity = (size_type)p_Var2;
    LogicalType::~LogicalType((LogicalType *)&local_40);
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "BoundParameterExpression::Invalidate requires a parameter as input","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BoundParameterExpression::Invalidate(Expression &expr) {
	if (expr.GetExpressionType() != ExpressionType::VALUE_PARAMETER) {
		throw InternalException("BoundParameterExpression::Invalidate requires a parameter as input");
	}
	auto &bound_parameter = expr.Cast<BoundParameterExpression>();
	bound_parameter.return_type = LogicalTypeId::SQLNULL;
	bound_parameter.parameter_data->return_type = LogicalTypeId::INVALID;
}